

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

void Curl_flush_cookies(Curl_easy *data,_Bool cleanup)

{
  CookieInfo *pCVar1;
  curl_trc_feat *pcVar2;
  int iVar3;
  char *pcVar4;
  Curl_llist_node *n;
  void *pvVar5;
  ulong uVar6;
  char *pcVar7;
  undefined7 in_register_00000031;
  char *pcVar8;
  undefined8 unaff_R12;
  size_t __nmemb;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  FILE *out;
  char *tempstore;
  CURLcode local_54;
  FILE *local_50;
  char *local_48;
  undefined4 local_40;
  uint local_3c;
  char *local_38;
  
  pcVar7 = (data->set).str[0x1b];
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  if (pcVar7 == (char *)0x0) goto LAB_00120277;
  pCVar1 = data->cookies;
  pcVar7 = (data->set).str[0x1b];
  local_50 = (FILE *)0x0;
  local_48 = (char *)0x0;
  local_54 = CURLE_OK;
  if (pCVar1 != (CookieInfo *)0x0) {
    remove_expired(pCVar1);
    iVar3 = strcmp("-",pcVar7);
    if (iVar3 == 0) {
      local_50 = _stdout;
      uVar6 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
LAB_0012004a:
      fputs("# Netscape HTTP Cookie File\n# https://curl.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
            ,local_50);
      if ((ulong)pCVar1->numcookies != 0) {
        local_3c = (uint)uVar6;
        pcVar4 = (char *)(*Curl_ccalloc)(1,(ulong)pCVar1->numcookies << 3);
        if (pcVar4 == (char *)0x0) {
          local_54 = CURLE_OUT_OF_MEMORY;
          bVar11 = true;
        }
        else {
          local_40 = (undefined4)CONCAT71(in_register_00000031,cleanup);
          lVar9 = 0;
          __nmemb = 0;
          local_38 = pcVar7;
          do {
            for (n = Curl_llist_head(pCVar1->cookielist + lVar9); n != (Curl_llist_node *)0x0;
                n = Curl_node_next(n)) {
              pvVar5 = Curl_node_elem(n);
              if (*(long *)((long)pvVar5 + 0x60) != 0) {
                *(void **)(pcVar4 + __nmemb * 8) = pvVar5;
                __nmemb = __nmemb + 1;
              }
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x3f);
          qsort(pcVar4,__nmemb,8,cookie_sort_ct);
          local_54 = CURLE_OK;
          if (__nmemb != 0) {
            local_54 = CURLE_OK;
            uVar6 = 0;
            uVar10 = 1;
            do {
              pcVar7 = get_netscape_format(*(Cookie **)(pcVar4 + uVar6 * 8));
              bVar11 = pcVar7 == (char *)0x0;
              if (bVar11) {
                local_54 = CURLE_OUT_OF_MEMORY;
                pcVar8 = pcVar4;
              }
              else {
                curl_mfprintf((FILE *)local_50,"%s\n",pcVar7);
                pcVar8 = pcVar7;
              }
              (*Curl_cfree)(pcVar8);
              if (pcVar7 == (char *)0x0) {
                cleanup = SUB41(local_40,0);
                pcVar7 = local_38;
                goto LAB_001201ac;
              }
              bVar11 = uVar10 < __nmemb;
              uVar6 = uVar10;
              uVar10 = (ulong)((int)uVar10 + 1);
            } while (bVar11);
          }
          (*Curl_cfree)(pcVar4);
          cleanup = SUB41(local_40,0);
          bVar11 = false;
          pcVar7 = local_38;
        }
LAB_001201ac:
        uVar6 = (ulong)local_3c;
        if (bVar11) goto LAB_001201f7;
        local_54 = CURLE_OK;
        if (bVar11) goto LAB_0012022c;
      }
      local_54 = CURLE_OK;
      if ((char)uVar6 == '\0') {
        fclose(local_50);
        local_50 = (FILE *)0x0;
        if ((local_48 != (char *)0x0) && (iVar3 = Curl_rename(local_48,pcVar7), iVar3 != 0)) {
          unlink(local_48);
          local_54 = CURLE_WRITE_ERROR;
          goto LAB_001201f7;
        }
      }
      (*Curl_cfree)(local_48);
    }
    else {
      local_54 = Curl_fopen(data,pcVar7,(FILE **)&local_50,&local_48);
      uVar6 = 0;
      if (local_54 == CURLE_OK) goto LAB_0012004a;
LAB_001201f7:
      if ((local_50 != (FILE *)0x0) && ((char)uVar6 == '\0')) {
        fclose(local_50);
      }
      (*Curl_cfree)(local_48);
    }
  }
LAB_0012022c:
  if ((((data != (Curl_easy *)0x0) && (local_54 != CURLE_OK)) &&
      (((data->set).field_0x89f & 0x40) != 0)) &&
     ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
    pcVar7 = (data->set).str[0x1b];
    pcVar4 = curl_easy_strerror(local_54);
    Curl_infof(data,"WARNING: failed to save cookies in %s: %s",pcVar7,pcVar4);
  }
LAB_00120277:
  if ((cleanup != false) &&
     ((data->share == (Curl_share *)0x0 || (data->cookies != data->share->cookies)))) {
    pCVar1 = data->cookies;
    if (pCVar1 != (CookieInfo *)0x0) {
      Curl_cookie_clearall(pCVar1);
      (*Curl_cfree)(pCVar1);
    }
    data->cookies = (CookieInfo *)0x0;
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, bool cleanup)
{
  CURLcode res;

  if(data->set.str[STRING_COOKIEJAR]) {
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    res = cookie_output(data, data->cookies, data->set.str[STRING_COOKIEJAR]);
    if(res)
      infof(data, "WARNING: failed to save cookies in %s: %s",
            data->set.str[STRING_COOKIEJAR], curl_easy_strerror(res));
  }
  else {
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = NULL;
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}